

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O3

void __thiscall
deqp::gls::BuiltinPrecisionTests::PrecisionCase::
testStatement<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Vector<float,3>,deqp::gls::BuiltinPrecisionTests::Void,deqp::gls::BuiltinPrecisionTests::Void,deqp::gls::BuiltinPrecisionTests::Void>,deqp::gls::BuiltinPrecisionTests::OutTypes<tcu::Matrix<float,3,4>,tcu::Vector<float,4>>>
          (PrecisionCase *this,
          Variables<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Vector<float,_3>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>,_deqp::gls::BuiltinPrecisionTests::OutTypes<tcu::Matrix<float,_3,_4>,_tcu::Vector<float,_4>_>_>
          *variables,
          Inputs<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Vector<float,_3>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
          *inputs,Statement *stmt)

{
  bool *pbVar1;
  ostringstream *poVar2;
  _Rb_tree_node_base *p_Var3;
  ostream *poVar4;
  pointer pVVar5;
  pointer pVVar6;
  Variable<tcu::Vector<float,_3>_> *pVVar7;
  pointer pcVar8;
  Variable<tcu::Matrix<float,_3,_4>_> *pVVar9;
  Variable<tcu::Vector<float,_4>_> *pVVar10;
  undefined7 uVar11;
  Variables<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Vector<float,_3>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>,_deqp::gls::BuiltinPrecisionTests::OutTypes<tcu::Matrix<float,_3,_4>,_tcu::Vector<float,_4>_>_>
  *pVVar12;
  ulong uVar13;
  ulong uVar14;
  FloatFormat *fmt;
  undefined8 uVar15;
  bool bVar16;
  bool bVar17;
  ContextType type;
  int iVar18;
  uint uVar19;
  _Rb_tree_node_base *p_Var20;
  char *__s;
  size_t sVar21;
  long *plVar22;
  ShaderExecutor *pSVar23;
  long lVar24;
  IVal *pIVar25;
  IVal *pIVar26;
  IVal *pIVar27;
  TestError *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar28;
  undefined1 *puVar29;
  Vector<float,_3> *val;
  double dVar30;
  Interval *__return_storage_ptr__;
  long lVar31;
  IVal *pIVar32;
  PrecisionCase *pPVar33;
  byte bVar34;
  IVal in2;
  IVal in1;
  IVal in3;
  ostringstream os;
  FloatFormat highpFmt;
  Environment env;
  Outputs<deqp::gls::BuiltinPrecisionTests::OutTypes<tcu::Matrix<float,_3,_4>,_tcu::Vector<float,_4>_>_>
  outputs;
  FuncSet funcs;
  ShaderSpec spec;
  ostringstream oss;
  undefined1 auStack_568 [8];
  PrecisionCase *local_560;
  Variables<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Vector<float,_3>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>,_deqp::gls::BuiltinPrecisionTests::OutTypes<tcu::Matrix<float,_3,_4>,_tcu::Vector<float,_4>_>_>
  *local_558;
  undefined1 local_550 [12];
  undefined4 uStack_544;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_540;
  ulong local_530;
  ulong local_528;
  Statement *local_520;
  undefined1 local_518 [16];
  undefined1 local_508 [56];
  string local_4d0;
  double local_4b0;
  Inputs<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Vector<float,_3>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
  *local_4a8;
  ResultCollector *local_4a0;
  undefined1 local_498 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_488;
  double local_478;
  Data local_470;
  Interval local_460 [2];
  ios_base local_428 [8];
  ios_base local_420 [264];
  FloatFormat local_318;
  ulong local_2f0;
  FloatFormat *local_2e8;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>_>
  local_2e0;
  Outputs<deqp::gls::BuiltinPrecisionTests::OutTypes<tcu::Matrix<float,_3,_4>,_tcu::Vector<float,_4>_>_>
  local_2b0;
  undefined1 local_280 [16];
  _Base_ptr local_270;
  _Rb_tree_node_base *local_268;
  _Rb_tree_node_base *local_260;
  double local_258;
  undefined1 local_220 [56];
  _Alloc_hider local_1e8;
  size_type local_1e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1d8;
  _Alloc_hider local_1c8;
  size_type local_1c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1b8;
  undefined1 local_1a8 [112];
  ios_base local_138 [264];
  
  bVar34 = 0;
  pVVar5 = (inputs->in0).
           super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pVVar6 = (inputs->in0).
           super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  dVar30 = (double)(((long)pVVar6 - (long)pVVar5 >> 2) * -0x5555555555555555);
  local_558 = variables;
  local_520 = stmt;
  local_4a8 = inputs;
  Outputs<deqp::gls::BuiltinPrecisionTests::OutTypes<tcu::Matrix<float,_3,_4>,_tcu::Vector<float,_4>_>_>
  ::Outputs(&local_2b0,(size_t)dVar30);
  local_1e8._M_p = (pointer)&local_1d8;
  local_220._0_4_ = GLSL_VERSION_300_ES;
  local_220._8_8_ = (pointer)0x0;
  local_220._16_8_ = (pointer)0x0;
  local_220._24_8_ = (pointer)0x0;
  local_220._32_8_ = (pointer)0x0;
  local_220._40_8_ = (pointer)0x0;
  local_220._48_8_ = (pointer)0x0;
  local_1e0 = 0;
  local_1d8._M_local_buf[0] = '\0';
  local_1c8._M_p = (pointer)&local_1b8;
  local_1c0 = 0;
  local_1b8._M_local_buf[0] = '\0';
  local_318.m_maxValue = (this->m_ctx).highpFormat.m_maxValue;
  local_318.m_minExp = (this->m_ctx).highpFormat.m_minExp;
  local_318.m_maxExp = (this->m_ctx).highpFormat.m_maxExp;
  local_318.m_fractionBits = (this->m_ctx).highpFormat.m_fractionBits;
  local_318.m_hasSubnormal = (this->m_ctx).highpFormat.m_hasSubnormal;
  local_318.m_hasInf = (this->m_ctx).highpFormat.m_hasInf;
  local_318.m_hasNaN = (this->m_ctx).highpFormat.m_hasNaN;
  local_318.m_exactPrecision = (this->m_ctx).highpFormat.m_exactPrecision;
  local_318._25_7_ = *(undefined7 *)&(this->m_ctx).highpFormat.field_0x19;
  local_2e0._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_2e0._M_impl.super__Rb_tree_header._M_header;
  local_2e0._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_2e0._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_2e0._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_498._0_8_ = ((this->super_TestCase).super_TestNode.m_testCtx)->m_log;
  poVar2 = (ostringstream *)(local_498 + 8);
  local_2e0._M_impl.super__Rb_tree_header._M_header._M_right =
       local_2e0._M_impl.super__Rb_tree_header._M_header._M_left;
  std::__cxx11::ostringstream::ostringstream(poVar2);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,"Statement: ",0xb);
  (*local_520->_vptr_Statement[2])(local_520,poVar2);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_498,(EndMessageToken *)&tcu::TestLog::EndMessage);
  local_560 = this;
  local_4b0 = dVar30;
  std::__cxx11::ostringstream::~ostringstream(poVar2);
  std::ios_base::~ios_base(local_420);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  p_Var3 = (_Rb_tree_node_base *)(local_280 + 8);
  local_280._8_4_ = _S_red;
  local_270 = (_Base_ptr)0x0;
  local_258 = 0.0;
  local_268 = p_Var3;
  local_260 = p_Var3;
  (*local_520->_vptr_Statement[4])(local_520,local_280);
  if (local_268 != p_Var3) {
    p_Var20 = local_268;
    do {
      (**(code **)(**(long **)(p_Var20 + 1) + 0x30))(*(long **)(p_Var20 + 1),local_1a8);
      p_Var20 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var20);
    } while (p_Var20 != p_Var3);
  }
  pPVar33 = local_560;
  if (local_258 != 0.0) {
    local_498._0_8_ = ((local_560->super_TestCase).super_TestNode.m_testCtx)->m_log;
    poVar2 = (ostringstream *)(local_498 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar2);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar2,"Reference definitions:\n",0x17);
    std::__cxx11::stringbuf::str();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar2,(char *)local_518._0_8_,local_518._8_8_);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_498,(EndMessageToken *)&tcu::TestLog::EndMessage);
    if ((IVal *)local_518._0_8_ != (IVal *)local_508) {
      operator_delete((void *)local_518._0_8_,local_508._0_8_ + 1);
    }
    std::__cxx11::ostringstream::~ostringstream(poVar2);
    std::ios_base::~ios_base(local_420);
  }
  std::
  _Rb_tree<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*,_const_deqp::gls::BuiltinPrecisionTests::FuncBase_*,_std::_Identity<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>,_std::less<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>,_std::allocator<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>_>
  ::~_Rb_tree((_Rb_tree<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*,_const_deqp::gls::BuiltinPrecisionTests::FuncBase_*,_std::_Identity<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>,_std::less<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>,_std::allocator<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>_>
               *)local_280);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base(local_138);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_498);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_498,"precision ",10);
  __s = glu::getPrecisionName((pPVar33->m_ctx).precision);
  if (__s == (char *)0x0) {
    std::ios::clear((int)(auStack_568 + *(long *)(local_498._0_8_ + -0x18)) + 0xd0);
  }
  else {
    sVar21 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_498,__s,sVar21);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_498," float;\n",8);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)&local_1e8,(string *)local_1a8);
  pcVar8 = local_1a8 + 0x10;
  if ((pointer)local_1a8._0_8_ != pcVar8) {
    operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_498);
  std::ios_base::~ios_base(local_428);
  type.super_ApiType.m_bits =
       (ApiType)(*((local_560->m_ctx).renderContext)->_vptr_RenderContext[2])();
  local_220._0_4_ = glu::getContextTypeGLSLVersion(type);
  if ((local_560->m_extension)._M_string_length != 0) {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8,
                   "#extension ",&local_560->m_extension);
    plVar22 = (long *)std::__cxx11::string::append(local_1a8);
    paVar28 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(plVar22 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar22 == paVar28) {
      local_488._M_allocated_capacity = paVar28->_M_allocated_capacity;
      local_488._8_8_ = plVar22[3];
      local_498._0_8_ = &local_488;
    }
    else {
      local_488._M_allocated_capacity = paVar28->_M_allocated_capacity;
      local_498._0_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)*plVar22;
    }
    local_498._8_8_ = plVar22[1];
    *plVar22 = (long)paVar28;
    plVar22[1] = 0;
    *(undefined1 *)(plVar22 + 2) = 0;
    std::__cxx11::string::operator=((string *)&local_1e8,(string *)local_498);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_498._0_8_ != &local_488) {
      operator_delete((void *)local_498._0_8_,local_488._M_allocated_capacity + 1);
    }
    if ((pointer)local_1a8._0_8_ != pcVar8) {
      operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
    }
  }
  std::vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
  ::resize((vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
            *)(local_220 + 8),1);
  makeSymbol<tcu::Vector<float,3>>
            ((Symbol *)local_498,local_560,
             (local_558->in0).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Vector<float,_3>_>_>
             .m_ptr);
  uVar15 = local_220._8_8_;
  std::__cxx11::string::operator=((string *)local_220._8_8_,(string *)local_498);
  glu::VarType::operator=((VarType *)(uVar15 + 0x20),(VarType *)&local_478);
  glu::VarType::~VarType((VarType *)&local_478);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_498._0_8_ != &local_488) {
    operator_delete((void *)local_498._0_8_,local_488._M_allocated_capacity + 1);
  }
  std::vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
  ::resize((vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
            *)(local_220 + 0x20),2);
  makeSymbol<tcu::Vector<float,4>>
            ((Symbol *)local_498,local_560,
             (local_558->out1).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Vector<float,_4>_>_>
             .m_ptr);
  uVar15 = local_220._32_8_;
  std::__cxx11::string::operator=((string *)(local_220._32_8_ + 0x38),(string *)local_498);
  glu::VarType::operator=(&((pointer)(uVar15 + 0x38))->varType,(VarType *)&local_478);
  glu::VarType::~VarType((VarType *)&local_478);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_498._0_8_ != &local_488) {
    operator_delete((void *)local_498._0_8_,local_488._M_allocated_capacity + 1);
  }
  makeSymbol<tcu::Matrix<float,3,4>>
            ((Symbol *)local_498,local_560,
             (local_558->out0).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Matrix<float,_3,_4>_>_>
             .m_ptr);
  uVar15 = local_220._32_8_;
  std::__cxx11::string::operator=((string *)local_220._32_8_,(string *)local_498);
  glu::VarType::operator=((VarType *)(uVar15 + 0x20),(VarType *)&local_478);
  glu::VarType::~VarType((VarType *)&local_478);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_498._0_8_ != &local_488) {
    operator_delete((void *)local_498._0_8_,local_488._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_498);
  (*local_520->_vptr_Statement[2])(local_520,local_498);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_498);
  std::ios_base::~ios_base(local_428);
  std::__cxx11::string::operator=((string *)&local_1c8,(string *)local_1a8);
  if ((pointer)local_1a8._0_8_ != pcVar8) {
    operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
  }
  pPVar33 = local_560;
  pSVar23 = ShaderExecUtil::createExecutor
                      ((local_560->m_ctx).renderContext,(local_560->m_ctx).shaderType,
                       (ShaderSpec *)local_220);
  dVar30 = local_4b0;
  local_498._0_8_ =
       (local_4a8->in0).
       super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_498._8_8_ =
       (local_4a8->in1).
       super__Vector_base<deqp::gls::BuiltinPrecisionTests::Void,_std::allocator<deqp::gls::BuiltinPrecisionTests::Void>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_488._M_allocated_capacity =
       (size_type)
       (local_4a8->in2).
       super__Vector_base<deqp::gls::BuiltinPrecisionTests::Void,_std::allocator<deqp::gls::BuiltinPrecisionTests::Void>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_488._8_8_ =
       (local_4a8->in3).
       super__Vector_base<deqp::gls::BuiltinPrecisionTests::Void,_std::allocator<deqp::gls::BuiltinPrecisionTests::Void>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_1a8._0_8_ =
       local_2b0.out0.
       super__Vector_base<tcu::Matrix<float,_3,_4>,_std::allocator<tcu::Matrix<float,_3,_4>_>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_1a8._8_8_ =
       local_2b0.out1.
       super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>._M_impl.
       super__Vector_impl_data._M_start;
  (*pSVar23->_vptr_ShaderExecutor[3])
            (pSVar23,((pPVar33->super_TestCase).super_TestNode.m_testCtx)->m_log);
  iVar18 = (*pSVar23->_vptr_ShaderExecutor[2])(pSVar23);
  if ((char)iVar18 == '\0') {
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,"Shader compilation failed",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsBuiltinPrecisionTests.cpp"
               ,0x11d4);
    __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  (*pSVar23->_vptr_ShaderExecutor[5])(pSVar23);
  (*pSVar23->_vptr_ShaderExecutor[6])(pSVar23,(ulong)dVar30 & 0xffffffff,local_498,local_1a8);
  local_2e8 = &(pPVar33->m_ctx).floatFormat;
  (*pSVar23->_vptr_ShaderExecutor[1])(pSVar23);
  lVar24 = 8;
  do {
    local_280[lVar24 + -8] = 0;
    *(undefined8 *)(local_280 + lVar24) = 0x7ff0000000000000;
    *(undefined8 *)(local_280 + lVar24 + 8) = 0xfff0000000000000;
    lVar24 = lVar24 + 0x18;
  } while (lVar24 != 0x50);
  lVar24 = 8;
  do {
    local_280[lVar24 + -8] = 0;
    *(undefined8 *)(local_280 + lVar24) = 0x7ff0000000000000;
    *(undefined8 *)(local_280 + lVar24 + 8) = 0xfff0000000000000;
    lVar24 = lVar24 + 0x18;
  } while (lVar24 != 0x50);
  tcu::Matrix<tcu::Interval,_3,_4>::Matrix((Matrix<tcu::Interval,_3,_4> *)local_498);
  pVVar12 = local_558;
  lVar24 = 8;
  do {
    local_1a8[lVar24 + -8] = 0;
    *(undefined8 *)(local_1a8 + lVar24) = 0x7ff0000000000000;
    *(undefined8 *)(local_1a8 + lVar24 + 8) = 0xfff0000000000000;
    lVar24 = lVar24 + 0x18;
  } while (lVar24 != 0x68);
  lVar24 = 8;
  do {
    local_1a8[lVar24 + -8] = 0;
    *(undefined8 *)(local_1a8 + lVar24) = 0x7ff0000000000000;
    *(undefined8 *)(local_1a8 + lVar24 + 8) = 0xfff0000000000000;
    lVar24 = lVar24 + 0x18;
  } while (lVar24 != 0x68);
  Environment::bind<tcu::Vector<float,3>>
            ((Environment *)&local_2e0,
             (local_558->in0).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Vector<float,_3>_>_>
             .m_ptr,(IVal *)local_280);
  Environment::bind<deqp::gls::BuiltinPrecisionTests::Void>
            ((Environment *)&local_2e0,
             (pVVar12->in1).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
             .m_ptr,(IVal *)local_518);
  Environment::bind<deqp::gls::BuiltinPrecisionTests::Void>
            ((Environment *)&local_2e0,
             (pVVar12->in2).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
             .m_ptr,(IVal *)local_550);
  Environment::bind<deqp::gls::BuiltinPrecisionTests::Void>
            ((Environment *)&local_2e0,
             (pVVar12->in3).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
             .m_ptr,(IVal *)(local_508 + 0x38));
  Environment::bind<tcu::Matrix<float,3,4>>
            ((Environment *)&local_2e0,
             (pVVar12->out0).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Matrix<float,_3,_4>_>_>
             .m_ptr,(IVal *)local_498);
  Environment::bind<tcu::Vector<float,4>>
            ((Environment *)&local_2e0,
             (pVVar12->out1).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Vector<float,_4>_>_>
             .m_ptr,(IVal *)local_1a8);
  if (pVVar6 == pVVar5) {
LAB_00888df9:
    local_498._0_8_ = ((pPVar33->super_TestCase).super_TestNode.m_testCtx)->m_log;
    poVar2 = (ostringstream *)(local_498 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,"All ",4);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2," inputs passed.",0xf);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_498,(EndMessageToken *)&tcu::TestLog::EndMessage);
  }
  else {
    local_4a0 = &pPVar33->m_status;
    local_2f0 = (long)dVar30 + (ulong)(dVar30 == 0.0);
    local_528 = 0;
    local_530 = 0;
    do {
      tcu::Matrix<tcu::Interval,_3,_4>::Matrix((Matrix<tcu::Interval,_3,_4> *)local_1a8);
      lVar24 = 8;
      do {
        local_280[lVar24 + -8] = 0;
        *(undefined8 *)(local_280 + lVar24) = 0x7ff0000000000000;
        *(undefined8 *)(local_280 + lVar24 + 8) = 0xfff0000000000000;
        lVar24 = lVar24 + 0x18;
      } while (lVar24 != 0x68);
      lVar24 = 8;
      do {
        local_280[lVar24 + -8] = 0;
        *(undefined8 *)(local_280 + lVar24) = 0x7ff0000000000000;
        *(undefined8 *)(local_280 + lVar24 + 8) = 0xfff0000000000000;
        lVar24 = lVar24 + 0x18;
      } while (lVar24 != 0x68);
      if ((local_528 & 0xfff) == 0) {
        tcu::TestContext::touchWatchdog((local_560->super_TestCase).super_TestNode.m_testCtx);
      }
      fmt = local_2e8;
      uVar13 = local_528;
      pVVar5 = (local_4a8->in0).
               super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>.
               _M_impl.super__Vector_impl_data._M_start;
      local_550._8_4_ = pVVar5[local_528].m_data[2];
      local_550._0_8_ = *(undefined8 *)pVVar5[local_528].m_data;
      ContainerTraits<tcu::Vector<float,_3>,_tcu::Vector<tcu::Interval,_3>_>::doRound
                ((IVal *)local_518,local_2e8,(Vector<float,_3> *)local_550);
      pVVar12 = local_558;
      ContainerTraits<tcu::Vector<float,_3>,_tcu::Vector<tcu::Interval,_3>_>::doConvert
                ((IVal *)local_498,fmt,(IVal *)local_518);
      pIVar25 = Environment::lookup<tcu::Vector<float,3>>
                          ((Environment *)&local_2e0,
                           (pVVar12->in0).
                           super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Vector<float,_3>_>_>
                           .m_ptr);
      pIVar26 = (IVal *)local_498;
      for (lVar24 = 9; lVar24 != 0; lVar24 = lVar24 + -1) {
        uVar11 = *(undefined7 *)&pIVar26->m_data[0].field_0x1;
        pIVar25->m_data[0].m_hasNaN = pIVar26->m_data[0].m_hasNaN;
        *(undefined7 *)&pIVar25->m_data[0].field_0x1 = uVar11;
        pIVar26 = (IVal *)((long)pIVar26 + ((ulong)bVar34 * -2 + 1) * 8);
        pIVar25 = (IVal *)((long)pIVar25 + ((ulong)bVar34 * -2 + 1) * 8);
      }
      Environment::lookup<deqp::gls::BuiltinPrecisionTests::Void>
                ((Environment *)&local_2e0,
                 (pVVar12->in1).
                 super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
                 .m_ptr);
      Environment::lookup<deqp::gls::BuiltinPrecisionTests::Void>
                ((Environment *)&local_2e0,
                 (pVVar12->in2).
                 super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
                 .m_ptr);
      Environment::lookup<deqp::gls::BuiltinPrecisionTests::Void>
                ((Environment *)&local_2e0,
                 (pVVar12->in3).
                 super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
                 .m_ptr);
      local_470.basic.type = (local_560->m_ctx).precision;
      local_478 = fmt->m_maxValue;
      local_498._0_8_ = *(undefined8 *)fmt;
      local_498._8_8_ = *(undefined8 *)&fmt->m_fractionBits;
      local_488._M_allocated_capacity = *(undefined8 *)&fmt->m_hasInf;
      local_488._8_8_ = *(undefined8 *)&fmt->m_exactPrecision;
      local_460[0].m_hasNaN = false;
      local_460[0]._1_3_ = 0;
      local_470._8_8_ = &local_2e0;
      (*local_520->_vptr_Statement[3])(local_520,(IVal *)local_498);
      pIVar26 = Environment::lookup<tcu::Vector<float,4>>
                          ((Environment *)&local_2e0,
                           (pVVar12->out1).
                           super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Vector<float,_4>_>_>
                           .m_ptr);
      ContainerTraits<tcu::Vector<float,_4>,_tcu::Vector<tcu::Interval,_4>_>::doConvert
                ((IVal *)local_498,&local_318,pIVar26);
      uVar14 = local_528;
      pIVar26 = (IVal *)local_498;
      pIVar32 = (IVal *)local_280;
      for (lVar24 = 0xc; lVar24 != 0; lVar24 = lVar24 + -1) {
        uVar11 = *(undefined7 *)&pIVar26->m_data[0].field_0x1;
        pIVar32->m_data[0].m_hasNaN = pIVar26->m_data[0].m_hasNaN;
        *(undefined7 *)&pIVar32->m_data[0].field_0x1 = uVar11;
        pIVar26 = (IVal *)((long)pIVar26 + ((ulong)bVar34 * -2 + 1) * 8);
        pIVar32 = (IVal *)((long)pIVar32 + ((ulong)bVar34 * -2 + 1) * 8);
      }
      bVar16 = ContainerTraits<tcu::Vector<float,_4>,_tcu::Vector<tcu::Interval,_4>_>::doContains
                         ((IVal *)local_280,
                          local_2b0.out1.
                          super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_start + local_528);
      local_498._0_8_ = &local_488;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_498,"Shader output 1 is outside acceptable range","");
      bVar16 = tcu::ResultCollector::check(local_4a0,bVar16,(string *)local_498);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_498._0_8_ != &local_488) {
        operator_delete((void *)local_498._0_8_,(ulong)(local_488._M_allocated_capacity + 1));
      }
      pIVar27 = Environment::lookup<tcu::Matrix<float,3,4>>
                          ((Environment *)&local_2e0,
                           (local_558->out0).
                           super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Matrix<float,_3,_4>_>_>
                           .m_ptr);
      __return_storage_ptr__ = (Interval *)local_498;
      ContainerTraits<tcu::Matrix<float,_3,_4>,_tcu::Matrix<tcu::Interval,_3,_4>_>::doConvert
                ((IVal *)__return_storage_ptr__,&local_318,pIVar27);
      puVar29 = local_1a8;
      lVar24 = 0;
      do {
        lVar31 = 0;
        do {
          *(undefined8 *)(puVar29 + lVar31 + 0x10) =
               *(undefined8 *)((long)&__return_storage_ptr__->m_hi + lVar31);
          pbVar1 = &((Vector<tcu::Vector<tcu::Interval,_3>,_4> *)&__return_storage_ptr__->m_hasNaN)
                    ->m_data[0].m_data[0].m_hasNaN + lVar31;
          dVar30 = *(double *)(pbVar1 + 8);
          *(undefined8 *)(puVar29 + lVar31) = *(undefined8 *)pbVar1;
          *(double *)((long)(puVar29 + lVar31) + 8) = dVar30;
          lVar31 = lVar31 + 0x48;
        } while (lVar31 != 0x120);
        lVar24 = lVar24 + 1;
        puVar29 = puVar29 + 0x18;
        __return_storage_ptr__ = __return_storage_ptr__ + 1;
      } while (lVar24 != 3);
      bVar17 = contains<tcu::Matrix<float,3,4>>
                         ((IVal *)local_1a8,
                          local_2b0.out0.
                          super__Vector_base<tcu::Matrix<float,_3,_4>,_std::allocator<tcu::Matrix<float,_3,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_start + uVar13);
      local_498._0_8_ = &local_488;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_498,"Shader output 0 is outside acceptable range","");
      bVar17 = tcu::ResultCollector::check(local_4a0,bVar17,(string *)local_498);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_498._0_8_ != &local_488) {
        operator_delete((void *)local_498._0_8_,(ulong)(local_488._M_allocated_capacity + 1));
      }
      if ((!bVar16 || !bVar17) &&
         (uVar19 = (int)local_530 + 1, local_530 = (ulong)uVar19, (int)uVar19 < 0x65)) {
        local_498._0_8_ = ((local_560->super_TestCase).super_TestNode.m_testCtx)->m_log;
        poVar2 = (ostringstream *)(local_498 + 8);
        std::__cxx11::ostringstream::ostringstream(poVar2);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,"Failed",6);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2," sample:\n",9);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,"\t",1);
        pVVar7 = (local_558->in0).
                 super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Vector<float,_3>_>_>
                 .m_ptr;
        val = (Vector<float,_3> *)local_508;
        pcVar8 = (pVVar7->m_name)._M_dataplus._M_p;
        local_518._0_8_ = val;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_518,pcVar8,pcVar8 + (pVVar7->m_name)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(local_498 + 8),(char *)local_518._0_8_,local_518._8_8_);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_498 + 8)," = ",3);
        valueToString<tcu::Vector<float,3>>
                  ((string *)local_550,(BuiltinPrecisionTests *)&local_318,
                   (FloatFormat *)
                   ((local_4a8->in0).
                    super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + uVar13),val);
        poVar4 = (ostream *)(local_498 + 8);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar4,(char *)local_550._0_8_,CONCAT44(uStack_544,local_550._8_4_));
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_550._0_8_ != &local_540) {
          operator_delete((void *)local_550._0_8_,local_540._M_allocated_capacity + 1);
        }
        if ((Vector<float,_3> *)local_518._0_8_ != (Vector<float,_3> *)local_508) {
          operator_delete((void *)local_518._0_8_,local_508._0_8_ + 1);
        }
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\t",1);
        pVVar9 = (local_558->out0).
                 super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Matrix<float,_3,_4>_>_>
                 .m_ptr;
        pIVar27 = (IVal *)local_508;
        pcVar8 = (pVVar9->m_name)._M_dataplus._M_p;
        local_518._0_8_ = pIVar27;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_518,pcVar8,pcVar8 + (pVVar9->m_name)._M_string_length);
        poVar4 = (ostream *)(local_498 + 8);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar4,(char *)local_518._0_8_,local_518._8_8_);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4," = ",3);
        valueToString<tcu::Matrix<float,3,4>>
                  ((string *)local_550,(BuiltinPrecisionTests *)&local_318,
                   (FloatFormat *)
                   (local_2b0.out0.
                    super__Vector_base<tcu::Matrix<float,_3,_4>,_std::allocator<tcu::Matrix<float,_3,_4>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + uVar13),
                   (Matrix<float,_3,_4> *)pIVar27);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar4,(char *)local_550._0_8_,CONCAT44(uStack_544,local_550._8_4_));
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\tExpected range: ",0x11);
        intervalToString<tcu::Matrix<float,3,4>>
                  ((string *)(local_508 + 0x38),(BuiltinPrecisionTests *)&local_318,
                   (FloatFormat *)local_1a8,pIVar27);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar4,local_4d0._M_dataplus._M_p,local_4d0._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4d0._M_dataplus._M_p != &local_4d0.field_2) {
          operator_delete(local_4d0._M_dataplus._M_p,local_4d0.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_550._0_8_ != &local_540) {
          operator_delete((void *)local_550._0_8_,local_540._M_allocated_capacity + 1);
        }
        if ((IVal *)local_518._0_8_ != (IVal *)local_508) {
          operator_delete((void *)local_518._0_8_,local_508._0_8_ + 1);
        }
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\t",1);
        pVVar10 = (local_558->out1).
                  super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Vector<float,_4>_>_>
                  .m_ptr;
        pIVar26 = (IVal *)local_508;
        pcVar8 = (pVVar10->m_name)._M_dataplus._M_p;
        local_518._0_8_ = pIVar26;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_518,pcVar8,pcVar8 + (pVVar10->m_name)._M_string_length);
        poVar4 = (ostream *)(local_498 + 8);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar4,(char *)local_518._0_8_,local_518._8_8_);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4," = ",3);
        valueToString<tcu::Vector<float,4>>
                  ((string *)local_550,(BuiltinPrecisionTests *)&local_318,
                   (FloatFormat *)
                   (local_2b0.out1.
                    super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + uVar14),(Vector<float,_4> *)pIVar26)
        ;
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar4,(char *)local_550._0_8_,CONCAT44(uStack_544,local_550._8_4_));
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\tExpected range: ",0x11);
        intervalToString<tcu::Vector<float,4>>
                  ((string *)(local_508 + 0x38),(BuiltinPrecisionTests *)&local_318,
                   (FloatFormat *)local_280,pIVar26);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar4,local_4d0._M_dataplus._M_p,local_4d0._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4d0._M_dataplus._M_p != &local_4d0.field_2) {
          operator_delete(local_4d0._M_dataplus._M_p,local_4d0.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_550._0_8_ != &local_540) {
          operator_delete((void *)local_550._0_8_,local_540._M_allocated_capacity + 1);
        }
        if ((IVal *)local_518._0_8_ != (IVal *)local_508) {
          operator_delete((void *)local_518._0_8_,local_508._0_8_ + 1);
        }
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_498,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_498 + 8));
        std::ios_base::~ios_base(local_420);
      }
      pPVar33 = local_560;
      local_528 = local_528 + 1;
    } while (local_528 != local_2f0);
    if ((int)local_530 < 0x65) {
      if ((int)local_530 == 0) goto LAB_00888df9;
    }
    else {
      local_498._0_8_ = ((local_560->super_TestCase).super_TestNode.m_testCtx)->m_log;
      poVar2 = (ostringstream *)(local_498 + 8);
      std::__cxx11::ostringstream::ostringstream(poVar2);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,"(Skipped ",9);
      std::ostream::operator<<(poVar2,(int)local_530 + -100);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2," messages.)",0xb);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_498,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar2);
      std::ios_base::~ios_base(local_420);
    }
    local_498._0_8_ = ((pPVar33->super_TestCase).super_TestNode.m_testCtx)->m_log;
    poVar2 = (ostringstream *)(local_498 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar2);
    std::ostream::operator<<(poVar2,(int)local_530);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,"/",1);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2," inputs failed.",0xf);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_498,(EndMessageToken *)&tcu::TestLog::EndMessage);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_498 + 8));
  std::ios_base::~ios_base(local_420);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>_>
  ::~_Rb_tree(&local_2e0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8._M_p != &local_1b8) {
    operator_delete(local_1c8._M_p,
                    CONCAT71(local_1b8._M_allocated_capacity._1_7_,local_1b8._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8._M_p != &local_1d8) {
    operator_delete(local_1e8._M_p,
                    CONCAT71(local_1d8._M_allocated_capacity._1_7_,local_1d8._M_local_buf[0]) + 1);
  }
  std::vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
  ::~vector((vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
             *)(local_220 + 0x20));
  std::vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
  ::~vector((vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
             *)(local_220 + 8));
  if (local_2b0.out1.
      super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_2b0.out1.
                    super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_2b0.out1.
                          super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_2b0.out1.
                          super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_2b0.out0.
      super__Vector_base<tcu::Matrix<float,_3,_4>,_std::allocator<tcu::Matrix<float,_3,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_2b0.out0.
                    super__Vector_base<tcu::Matrix<float,_3,_4>,_std::allocator<tcu::Matrix<float,_3,_4>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_2b0.out0.
                          super__Vector_base<tcu::Matrix<float,_3,_4>,_std::allocator<tcu::Matrix<float,_3,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_2b0.out0.
                          super__Vector_base<tcu::Matrix<float,_3,_4>,_std::allocator<tcu::Matrix<float,_3,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void PrecisionCase::testStatement (const Variables<In, Out>&	variables,
								   const Inputs<In>&			inputs,
								   const Statement&				stmt)
{
	using namespace ShaderExecUtil;

	typedef typename	In::In0		In0;
	typedef typename	In::In1		In1;
	typedef typename	In::In2		In2;
	typedef typename	In::In3		In3;
	typedef typename	Out::Out0	Out0;
	typedef typename	Out::Out1	Out1;

	const FloatFormat&	fmt			= getFormat();
	const int			inCount		= numInputs<In>();
	const int			outCount	= numOutputs<Out>();
	const size_t		numValues	= (inCount > 0) ? inputs.in0.size() : 1;
	Outputs<Out>		outputs		(numValues);
	ShaderSpec			spec;
	const FloatFormat	highpFmt	= m_ctx.highpFormat;
	const int			maxMsgs		= 100;
	int					numErrors	= 0;
	Environment			env;		// Hoisted out of the inner loop for optimization.

	switch (inCount)
	{
		case 4: DE_ASSERT(inputs.in3.size() == numValues);
		case 3: DE_ASSERT(inputs.in2.size() == numValues);
		case 2: DE_ASSERT(inputs.in1.size() == numValues);
		case 1: DE_ASSERT(inputs.in0.size() == numValues);
		default: break;
	}

	// Print out the statement and its definitions
	log() << TestLog::Message << "Statement: " << stmt << TestLog::EndMessage;
	{
		ostringstream	oss;
		FuncSet			funcs;

		stmt.getUsedFuncs(funcs);
		for (FuncSet::const_iterator it = funcs.begin(); it != funcs.end(); ++it)
		{
			(*it)->printDefinition(oss);
		}
		if (!funcs.empty())
			log() << TestLog::Message << "Reference definitions:\n" << oss.str()
				  << TestLog::EndMessage;
	}

	// Initialize ShaderSpec from precision, variables and statement.
	{
		ostringstream os;
		os << "precision " << glu::getPrecisionName(m_ctx.precision) << " float;\n";
		spec.globalDeclarations = os.str();
	}

	spec.version = getContextTypeGLSLVersion(getRenderContext().getType());

	if (!m_extension.empty())
		spec.globalDeclarations = "#extension " + m_extension + " : require\n";

	spec.inputs.resize(inCount);

	switch (inCount)
	{
		case 4: spec.inputs[3] = makeSymbol(*variables.in3);
		case 3:	spec.inputs[2] = makeSymbol(*variables.in2);
		case 2:	spec.inputs[1] = makeSymbol(*variables.in1);
		case 1:	spec.inputs[0] = makeSymbol(*variables.in0);
		default: break;
	}

	spec.outputs.resize(outCount);

	switch (outCount)
	{
		case 2:	spec.outputs[1] = makeSymbol(*variables.out1);
		case 1:	spec.outputs[0] = makeSymbol(*variables.out0);
		default: break;
	}

	spec.source = de::toString(stmt);

	// Run the shader with inputs.
	{
		UniquePtr<ShaderExecutor>	executor		(createExecutor(getRenderContext(),
																	m_ctx.shaderType,
																	spec));
		const void*					inputArr[]		=
		{
			&inputs.in0.front(), &inputs.in1.front(), &inputs.in2.front(), &inputs.in3.front(),
		};
		void*						outputArr[]		=
		{
			&outputs.out0.front(), &outputs.out1.front(),
		};

		executor->log(log());
		if (!executor->isOk())
			TCU_FAIL("Shader compilation failed");

		executor->useProgram();
		executor->execute(int(numValues), inputArr, outputArr);
	}

	// Initialize environment with dummy values so we don't need to bind in inner loop.
	{
		const typename Traits<In0>::IVal		in0;
		const typename Traits<In1>::IVal		in1;
		const typename Traits<In2>::IVal		in2;
		const typename Traits<In3>::IVal		in3;
		const typename Traits<Out0>::IVal		reference0;
		const typename Traits<Out1>::IVal		reference1;

		env.bind(*variables.in0, in0);
		env.bind(*variables.in1, in1);
		env.bind(*variables.in2, in2);
		env.bind(*variables.in3, in3);
		env.bind(*variables.out0, reference0);
		env.bind(*variables.out1, reference1);
	}

	// For each input tuple, compute output reference interval and compare
	// shader output to the reference.
	for (size_t valueNdx = 0; valueNdx < numValues; valueNdx++)
	{
		bool						result		= true;
		typename Traits<Out0>::IVal	reference0;
		typename Traits<Out1>::IVal	reference1;

		if (valueNdx % (size_t)TOUCH_WATCHDOG_VALUE_FREQUENCY == 0)
			m_testCtx.touchWatchdog();

		env.lookup(*variables.in0) = convert<In0>(fmt, round(fmt, inputs.in0[valueNdx]));
		env.lookup(*variables.in1) = convert<In1>(fmt, round(fmt, inputs.in1[valueNdx]));
		env.lookup(*variables.in2) = convert<In2>(fmt, round(fmt, inputs.in2[valueNdx]));
		env.lookup(*variables.in3) = convert<In3>(fmt, round(fmt, inputs.in3[valueNdx]));

		{
			EvalContext	ctx (fmt, m_ctx.precision, env);
			stmt.execute(ctx);
		}

		switch (outCount)
		{
			case 2:
				reference1 = convert<Out1>(highpFmt, env.lookup(*variables.out1));
				if (!m_status.check(contains(reference1, outputs.out1[valueNdx]),
									"Shader output 1 is outside acceptable range"))
					result = false;
			case 1:
				reference0 = convert<Out0>(highpFmt, env.lookup(*variables.out0));
				if (!m_status.check(contains(reference0, outputs.out0[valueNdx]),
									"Shader output 0 is outside acceptable range"))
					result = false;
			default: break;
		}

		if (!result)
			++numErrors;

		if ((!result && numErrors <= maxMsgs) || GLS_LOG_ALL_RESULTS)
		{
			MessageBuilder	builder	= log().message();

			builder << (result ? "Passed" : "Failed") << " sample:\n";

			if (inCount > 0)
			{
				builder << "\t" << variables.in0->getName() << " = "
						<< valueToString(highpFmt, inputs.in0[valueNdx]) << "\n";
			}

			if (inCount > 1)
			{
				builder << "\t" << variables.in1->getName() << " = "
						<< valueToString(highpFmt, inputs.in1[valueNdx]) << "\n";
			}

			if (inCount > 2)
			{
				builder << "\t" << variables.in2->getName() << " = "
						<< valueToString(highpFmt, inputs.in2[valueNdx]) << "\n";
			}

			if (inCount > 3)
			{
				builder << "\t" << variables.in3->getName() << " = "
						<< valueToString(highpFmt, inputs.in3[valueNdx]) << "\n";
			}

			if (outCount > 0)
			{
				builder << "\t" << variables.out0->getName() << " = "
						<< valueToString(highpFmt, outputs.out0[valueNdx]) << "\n"
						<< "\tExpected range: "
						<< intervalToString<typename Out::Out0>(highpFmt, reference0) << "\n";
			}

			if (outCount > 1)
			{
				builder << "\t" << variables.out1->getName() << " = "
						<< valueToString(highpFmt, outputs.out1[valueNdx]) << "\n"
						<< "\tExpected range: "
						<< intervalToString<typename Out::Out1>(highpFmt, reference1) << "\n";
			}

			builder << TestLog::EndMessage;
		}
	}

	if (numErrors > maxMsgs)
	{
		log() << TestLog::Message << "(Skipped " << (numErrors - maxMsgs) << " messages.)"
			  << TestLog::EndMessage;
	}

	if (numErrors == 0)
	{
		log() << TestLog::Message << "All " << numValues << " inputs passed."
			  << TestLog::EndMessage;
	}
	else
	{
		log() << TestLog::Message << numErrors << "/" << numValues << " inputs failed."
			  << TestLog::EndMessage;
	}
}